

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPML_TAGGED_PCR_PROPERTY_Unmarshal
                 (TPML_TAGGED_PCR_PROPERTY *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  ulong uVar4;
  TPMS_TAGGED_PCR_SELECT *target_00;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    target->count = UVar2;
    *buffer = *buffer + 4;
    TVar3 = 0x84;
    if (UVar2 < 0x80) {
      TVar3 = 0;
      if (UVar2 != 0) {
        target_00 = target->pcrProperty;
        uVar4 = (ulong)UVar2;
        do {
          TVar3 = TPMS_TAGGED_PCR_SELECT_Unmarshal(target_00,buffer,size);
          if (TVar3 != 0) {
            return TVar3;
          }
          target_00 = target_00 + 1;
          uVar4 = uVar4 - 1;
          TVar3 = 0;
        } while (uVar4 != 0);
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC UINT32_Unmarshal(UINT32 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 4) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT32(*buffer);
        *buffer += 4;
        result = TPM_RC_SUCCESS;
    }
    return result;
}